

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O2

char * google::protobuf::internal::TcParser::FastV8S2
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  uint uVar1;
  ulong uVar2;
  char *pcVar3;
  uint *puVar4;
  ulong hasbits_00;
  ushort *puVar5;
  
  if (data.field_0._0_2_ != 0) {
    pcVar3 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar3;
  }
  hasbits_00 = hasbits | 1L << ((ulong)data.field_0 >> 0x10 & 0x3f);
  if (ptr[2] < '\0') {
    pcVar3 = SingularVarBigint<bool,unsigned_short,false>(msg,ptr + 2,ctx,data,table,hasbits_00);
    return pcVar3;
  }
  puVar5 = (ushort *)(ptr + 3);
  *(bool *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30)) = ptr[2] != '\0';
  if ((ctx->super_EpsCopyInputStream).limit_end_ <= puVar5) {
    if ((ulong)table->has_bits_offset != 0) {
      puVar4 = RefAt<unsigned_int>(msg,(ulong)table->has_bits_offset);
      *puVar4 = *puVar4 | (uint)hasbits_00;
    }
    return (char *)puVar5;
  }
  uVar1 = (uint)table->fast_idx_mask & (uint)*puVar5;
  if ((uVar1 & 7) == 0) {
    uVar2 = (ulong)(uVar1 & 0xfffffff8);
    pcVar3 = (char *)(**(code **)(&table[1].has_bits_offset + uVar2))
                               (msg,puVar5,ctx,
                                (ulong)*puVar5 ^ *(ulong *)(&table[1].fast_idx_mask + uVar2 * 2),
                                table,hasbits_00);
    return pcVar3;
  }
  protobuf_assumption_failed
            ("(idx & 7) == 0",
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
             ,0x452);
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastV8S2(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularVarint<bool, uint16_t>(
      PROTOBUF_TC_PARAM_PASS);
}